

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

void Saig_ManWindowCreatePis(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Ptr_t *vNodes0)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int i;
  
  i = 0;
  do {
    if (vNodes0->nSize <= i) {
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0,i);
    iVar1 = Saig_ObjIsLo(p0,pAVar2);
    if (iVar1 == 0) {
      if ((*(uint *)&pAVar2->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x265,
                      "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                     );
      }
      pAVar3 = (Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe);
      iVar1 = pAVar3->TravId;
      if ((pAVar3->TravId != p0->nTravIds) &&
         (iVar1 = p0->nTravIds, (pAVar3->field_5).pData == (void *)0x0)) {
        pAVar4 = Aig_ObjCreateCi(pNew);
        (pAVar3->field_5).pData = pAVar4;
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = p0->pReprs[pAVar3->Id];
        }
        if ((p1->pReprs == (Aig_Obj_t **)0x0) || (p1->pReprs[pAVar5->Id] != pAVar3)) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x26b,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        (pAVar5->field_5).pData = pAVar4;
        iVar1 = p0->nTravIds;
      }
      pAVar2 = (Aig_Obj_t *)((ulong)pAVar2->pFanin1 & 0xfffffffffffffffe);
      if ((pAVar2->TravId != iVar1) && ((pAVar2->field_5).pData == (void *)0x0)) {
        pAVar3 = Aig_ObjCreateCi(pNew);
        (pAVar2->field_5).pData = pAVar3;
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = p0->pReprs[pAVar2->Id];
        }
        if ((p1->pReprs == (Aig_Obj_t **)0x0) || (p1->pReprs[pAVar4->Id] != pAVar2)) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x275,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        goto LAB_005a179c;
      }
    }
    else {
      pAVar2 = Saig_ObjLoToLi(p0,pAVar2);
      pAVar2 = (Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe);
      if ((pAVar2->TravId != p0->nTravIds) && ((pAVar2->field_5).pData == (void *)0x0)) {
        pAVar3 = Aig_ObjCreateCi(pNew);
        (pAVar2->field_5).pData = pAVar3;
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = p0->pReprs[pAVar2->Id];
        }
        if ((p1->pReprs == (Aig_Obj_t **)0x0) || (p1->pReprs[pAVar4->Id] != pAVar2)) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x25d,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
LAB_005a179c:
        (pAVar4->field_5).pData = pAVar3;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Saig_ManWindowCreatePis( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Ptr_t * vNodes0 )
{
    Aig_Obj_t * pObj, * pMatch, * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj, i )
    {
        if ( Saig_ObjIsLo(p0, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p0, pObj );
            pFanin = Aig_ObjFanin0(pMatch);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj) );
            pFanin = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
            pFanin = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
    }
//    printf( "Added %d primary inputs.\n", Counter );
}